

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
          (SourceLocationCommentPrinter *this,string *output)

{
  long lVar1;
  string *in_RSI;
  byte *in_RDI;
  string *in_stack_00000230;
  SourceLocationCommentPrinter *in_stack_00000238;
  string local_30 [32];
  string *local_10;
  
  if ((*in_RDI & 1) != 0) {
    local_10 = in_RSI;
    lVar1 = std::__cxx11::string::size();
    if (lVar1 != 0) {
      FormatComment(in_stack_00000238,in_stack_00000230);
      std::__cxx11::string::operator+=(local_10,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  return;
}

Assistant:

void AddPostComment(std::string* output) {
    if (have_source_loc_ && source_loc_.trailing_comments.size() > 0) {
      *output += FormatComment(source_loc_.trailing_comments);
    }
  }